

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNConst::gen_code_new
          (CTPNConst *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int param_6,
          int is_transient)

{
  tc_constval_type_t tVar1;
  tc_metaclass_t meta;
  ulong uVar2;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  
  tVar1 = CTcConstVal::get_type((CTcConstVal *)(in_RDI + 8));
  if (tVar1 == TC_CVT_OBJ) {
    uVar2 = CTcConstVal::get_val_obj((CTcConstVal *)(in_RDI + 8));
    meta = (tc_metaclass_t)uVar2;
    CTcConstVal::get_val_obj_meta((CTcConstVal *)(in_RDI + 8));
    CTcSymObj::s_gen_code_new
              ((int)((ulong)in_RDI >> 0x20),(vm_obj_id_t)in_RDI,meta,in_ESI,
               in_stack_ffffffffffffffc4,
               (CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_00000008),in_R8D);
  }
  else {
    CTcTokenizer::log_error(0x2cf8);
  }
  return;
}

Assistant:

void CTPNConst::gen_code_new(int discard,
                             int argc, int varargs, CTcNamedArgs *named_args,
                             int /*from_call*/, int is_transient)
{
    /* check the type */
    switch(val_.get_type())
    {
    case TC_CVT_OBJ:
        /* 
         *   Treat this the same as any other 'new' call.  An object symbol
         *   folded into a constant is guaranteed to be of metaclass
         *   TadsObject - that's the only kind of symbol we'll ever fold this
         *   way. 
         */
        CTcSymObj::s_gen_code_new(discard,
                                  val_.get_val_obj(), val_.get_val_obj_meta(),
                                  argc, varargs, named_args, is_transient);
        break;

    default:
        /* can't apply 'new' to other constant values */
        G_tok->log_error(TCERR_INVAL_NEW_EXPR);
        break;
    }
}